

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall
slang::ast::Scope::tryFixupInstances
          (Scope *this,DataDeclarationSyntax *syntax,ASTContext *context,
          SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  int iVar1;
  int *piVar2;
  string_view lookupName;
  DefinitionLookupResult local_40;
  
  piVar2 = *(int **)&(syntax->type).ptr[1].super_ExpressionSyntax.super_SyntaxNode;
  iVar1 = *piVar2;
  if ((iVar1 == 0xe5) || (iVar1 == 0x4b)) {
    lookupName = parsing::Token::valueText((Token *)(piVar2 + 6));
  }
  else {
    lookupName = (string_view)(ZEXT816(0x9db414) << 0x40);
  }
  Compilation::tryGetDefinition(&local_40,this->compilation,lookupName,this);
  if ((((DefinitionSymbol *)local_40.definition != (DefinitionSymbol *)0x0) &&
      (((Symbol *)&(local_40.definition)->kind)->kind == Definition)) &&
     ((*(DefinitionKind *)((long)local_40.definition + 0x48) != Interface ||
      ((this->thisSym->kind != InstanceBody || (this->thisSym[2].name._M_str[0x2d8] == '\0')))))) {
    InstanceSymbol::fromFixupSyntax
              (this->compilation,(DefinitionSymbol *)local_40.definition,syntax,context,results);
  }
  return;
}

Assistant:

void Scope::tryFixupInstances(const DataDeclarationSyntax& syntax, const ASTContext& context,
                              SmallVectorBase<const Symbol*>& results) const {
    auto& namedType = syntax.type->as<NamedTypeSyntax>();
    std::string_view name = getIdentifierName(namedType);
    auto def = compilation.tryGetDefinition(name, *this).definition;
    if (!def || def->kind != SymbolKind::Definition)
        return;

    // Matching the check in handleDataDeclaration -- if this is true we
    // handle this as a non-ansi interface port declaration instead.
    auto& defSym = def->as<DefinitionSymbol>();
    if (defSym.definitionKind == DefinitionKind::Interface &&
        asSymbol().kind == SymbolKind::InstanceBody &&
        asSymbol().as<InstanceBodySymbol>().getDefinition().hasNonAnsiPorts) {
        return;
    }

    // Assume this is malformed instantiation syntax and create the instances anyway.
    InstanceSymbol::fromFixupSyntax(compilation, defSym, syntax, context, results);
}